

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_get___proto__(JSContext *ctx,JSValue this_val)

{
  JSValue obj;
  JSValue JVar1;
  
  obj = JS_ToObject(ctx,this_val);
  if ((int)obj.tag != 6) {
    JVar1 = JS_GetPrototype(ctx,obj);
    JS_FreeValue(ctx,obj);
    obj = JVar1;
  }
  return obj;
}

Assistant:

static JSValue js_object_get___proto__(JSContext *ctx, JSValueConst this_val)
{
    JSValue val, ret;

    val = JS_ToObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    ret = JS_GetPrototype(ctx, val);
    JS_FreeValue(ctx, val);
    return ret;
}